

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_47(QPDF *pdf,char *arg2)

{
  long lVar1;
  ostream *poVar2;
  ulong __n;
  allocator<char> local_ca;
  allocator<char> local_c9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_70 [32];
  QPDFPageLabelDocumentHelper pldh;
  
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&pldh,pdf);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/Pages",&local_c9);
  QPDFObjectHandle::getKey(local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&labels,"/Count",&local_ca);
  QPDFObjectHandle::getKey(local_80);
  lVar1 = QPDFObjectHandle::getIntValue();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__cxx11::string::~string((string *)&labels);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string(local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QPDFPageLabelDocumentHelper::getLabelsForPageRange((longlong)&pldh,0,lVar1 + -1,(vector *)0x1);
  if (((int)labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
            super__Vector_impl_data._M_finish -
       (int)labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
            super__Vector_impl_data._M_start & 0x10U) == 0) {
    for (__n = 0; __n < (ulong)((long)labels.
                                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)labels.
                                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 2
        ) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&labels,__n);
      QPDFObjectHandle::getIntValue();
      poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      poVar2 = std::operator<<(poVar2," ");
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&labels,__n + 1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_70);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_70);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&labels);
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
    return;
  }
  __assert_fail("labels.size() % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x713,"void test_47(QPDF &, const char *)");
}

Assistant:

static void
test_47(QPDF& pdf, char const* arg2)
{
    // Test page labels.
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue();
    std::vector<QPDFObjectHandle> labels;
    pldh.getLabelsForPageRange(0, npages - 1, 1, labels);
    assert(labels.size() % 2 == 0);
    for (size_t i = 0; i < labels.size(); i += 2) {
        std::cout << labels.at(i).getIntValue() << " " << labels.at(i + 1).unparse() << std::endl;
    }
}